

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

Gia_Man_t * Gia_ManPerformMappingInt(Gia_Man_t *p,If_Par_t *pPars)

{
  char cVar1;
  uint *puVar2;
  If_Par_t *pIVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  If_Man_t *pIfMan;
  If_DsdMan_t *pIVar7;
  char *pcVar8;
  Tim_Man_t *pTVar9;
  long lVar10;
  Gia_Man_t *p_00;
  Vec_Int_t *pVVar11;
  int *piVar12;
  Vec_Ptr_t *pVVar13;
  char *pcVar14;
  size_t sVar15;
  uint fUnitDelay;
  
  if (pPars->pTimesArr != (float *)0x0) {
    __assert_fail("pPars->pTimesArr == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                  ,0x8d8,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
  }
  if (pPars->pTimesReq != (float *)0x0) {
    __assert_fail("pPars->pTimesReq == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                  ,0x8d9,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
  }
  pVVar11 = p->vCiArrs;
  if (pVVar11 != (Vec_Int_t *)0x0) {
    iVar5 = pVVar11->nSize;
    if (iVar5 != p->vCis->nSize) {
      __assert_fail("Vec_IntSize(p->vCiArrs) == Gia_ManCiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                    ,0x8dc,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
    }
    pfVar6 = (float *)calloc((long)iVar5,4);
    pPars->pTimesArr = pfVar6;
    if (0 < iVar5) {
      piVar12 = pVVar11->pArray;
      sVar15 = 0;
      do {
        pfVar6[sVar15] = (float)piVar12[sVar15];
        sVar15 = sVar15 + 1;
      } while ((long)iVar5 != sVar15);
    }
  }
  pVVar11 = p->vCoReqs;
  if (pVVar11 != (Vec_Int_t *)0x0) {
    iVar5 = pVVar11->nSize;
    if (iVar5 != p->vCos->nSize) {
      __assert_fail("Vec_IntSize(p->vCoReqs) == Gia_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                    ,0x8ec,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
    }
    pfVar6 = (float *)calloc((long)iVar5,4);
    pPars->pTimesReq = pfVar6;
    if (0 < iVar5) {
      piVar12 = pVVar11->pArray;
      sVar15 = 0;
      do {
        pfVar6[sVar15] = (float)piVar12[sVar15];
        sVar15 = sVar15 + 1;
      } while ((long)iVar5 != sVar15);
    }
  }
  if (p->pCellStr != (char *)0x0) {
    free(p->pCellStr);
    p->pCellStr = (char *)0x0;
  }
  pVVar11 = p->vConfigs;
  if (pVVar11 != (Vec_Int_t *)0x0) {
    if (pVVar11->pArray != (int *)0x0) {
      free(pVVar11->pArray);
      p->vConfigs->pArray = (int *)0x0;
      pVVar11 = p->vConfigs;
      if (pVVar11 == (Vec_Int_t *)0x0) goto LAB_00210887;
    }
    free(pVVar11);
    p->vConfigs = (Vec_Int_t *)0x0;
  }
LAB_00210887:
  if ((((((pPars->fDelayOpt == 0) && (pPars->fDelayOptLut == 0)) && (pPars->fDsdBalance == 0)) &&
       ((pPars->fUserRecLib == 0 && (pPars->fUserSesLib == 0)))) &&
      ((pPars->fDeriveLuts == 0 && ((pPars->fUseDsd == 0 && (pPars->fUseTtPerm == 0)))))) &&
     (pPars->pFuncCell2 == (_func_int_If_Man_t_ptr_word_ptr_int_Vec_Str_t_ptr_char_ptr_ptr *)0x0)) {
    pPars->fCutMin = 0;
  }
  pIfMan = Gia_ManToIf(p,pPars);
  if (pIfMan == (If_Man_t *)0x0) {
    return (Gia_Man_t *)0x0;
  }
  if (pPars->fUseDsd != 0) {
    pIVar7 = (If_DsdMan_t *)Abc_FrameReadManDsd();
    iVar5 = pPars->nLutSize;
    iVar4 = If_DsdManVarNum(pIVar7);
    if (iVar4 < iVar5) {
      __assert_fail("pPars->nLutSize <= If_DsdManVarNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                    ,0x907,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
    }
    pcVar8 = pPars->pLutStruct;
    if (pcVar8 == (char *)0x0) {
      iVar5 = If_DsdManLutSize(pIVar7);
      if (iVar5 != 0) {
        pcVar8 = pPars->pLutStruct;
        if (pcVar8 == (char *)0x0) goto LAB_00210cf6;
        goto LAB_00210935;
      }
    }
    else {
LAB_00210935:
      cVar1 = *pcVar8;
      iVar5 = If_DsdManLutSize(pIVar7);
      if (cVar1 + -0x30 != iVar5) {
LAB_00210cf6:
        __assert_fail("(pPars->pLutStruct == NULL && If_DsdManLutSize(p) == 0) || (pPars->pLutStruct && pPars->pLutStruct[0] - \'0\' == If_DsdManLutSize(p))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                      ,0x908,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
      }
    }
    pIVar7 = (If_DsdMan_t *)Abc_FrameReadManDsd();
    pIfMan->pIfDsdMan = pIVar7;
    if (pPars->fDsdBalance != 0) {
      If_DsdManAllocIsops(pIVar7,pPars->nLutSize);
    }
  }
  if (pPars->fPower != 0) {
    if (p->pManTime == (void *)0x0) {
      If_ManComputeSwitching(pIfMan);
    }
    else {
      Abc_Print(0,"Switching activity computation for designs with boxes is disabled.\n");
    }
  }
  if (pPars->pReoMan != (void *)0x0) {
    pIfMan->pUserMan = pPars->pReoMan;
  }
  if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
    fUnitDelay = 1;
    if ((((pPars->fDelayOpt == 0) && (pPars->fDelayOptLut == 0)) && (pPars->fDsdBalance == 0)) &&
       (pPars->fUserRecLib == 0)) {
      fUnitDelay = (uint)(pPars->fUserSesLib != 0);
    }
    pTVar9 = Tim_ManDup((Tim_Man_t *)p->pManTime,fUnitDelay);
    pIfMan->pManTim = pTVar9;
  }
  pVVar11 = p->vCoAttrs;
  if (pVVar11 != (Vec_Int_t *)0x0) {
    if (pIfMan->nObjs[3] != pVVar11->nSize) {
      __assert_fail("If_ManCoNum(pIfMan) == Vec_IntSize(p->vCoAttrs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                    ,0x91c,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
    }
    if (0 < pIfMan->nObjs[3]) {
      lVar10 = 0;
      do {
        if (pIfMan->vCos->nSize <= lVar10) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        puVar2 = *(uint **)((long)pIfMan->vCos->pArray[lVar10] + 0x18);
        *puVar2 = *puVar2 & 0xfffffbff | (uint)(pVVar11->pArray[lVar10] != 0) << 10;
        lVar10 = lVar10 + 1;
        pVVar11 = p->vCoAttrs;
      } while (lVar10 < pVVar11->nSize);
    }
  }
  iVar5 = If_ManPerformMapping(pIfMan);
  if (iVar5 == 0) {
    If_ManStop(pIfMan);
    return (Gia_Man_t *)0x0;
  }
  if (pPars->pFuncWrite != (_func_int_If_Man_t_ptr *)0x0) {
    (*pPars->pFuncWrite)(pIfMan);
  }
  pIVar3 = pIfMan->pPars;
  if (((pIVar3->fDelayOpt == 0) && (pIVar3->fDsdBalance == 0)) &&
     ((pIVar3->fUserRecLib == 0 && (pIVar3->fUserSesLib == 0)))) {
    p_00 = Gia_ManFromIfLogic(pIfMan);
  }
  else {
    p_00 = Gia_ManFromIfAig(pIfMan);
  }
  if ((p->vCiArrs == (Vec_Int_t *)0x0) && (p->vCoReqs == (Vec_Int_t *)0x0)) goto LAB_00210b8a;
  pVVar11 = p->vCoArrs;
  if (pVVar11 != (Vec_Int_t *)0x0) {
    if (pVVar11->pArray != (int *)0x0) {
      free(pVVar11->pArray);
      p->vCoArrs->pArray = (int *)0x0;
      pVVar11 = p->vCoArrs;
      if (pVVar11 == (Vec_Int_t *)0x0) goto LAB_00210af3;
    }
    free(pVVar11);
  }
LAB_00210af3:
  iVar5 = p->vCos->nSize;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar4 = iVar5;
  }
  pVVar11->nSize = 0;
  pVVar11->nCap = iVar4;
  if (iVar4 == 0) {
    piVar12 = (int *)0x0;
  }
  else {
    piVar12 = (int *)malloc((long)iVar4 << 2);
  }
  pVVar11->pArray = piVar12;
  p->vCoArrs = pVVar11;
  pVVar13 = pIfMan->vCos;
  if (0 < pVVar13->nSize) {
    lVar10 = 0;
    do {
      Vec_IntPush(p->vCoArrs,(int)*(float *)(*(long *)((long)pVVar13->pArray[lVar10] + 0x18) + 0x5c)
                 );
      lVar10 = lVar10 + 1;
      pVVar13 = pIfMan->vCos;
    } while (lVar10 < pVVar13->nSize);
  }
LAB_00210b8a:
  If_ManStop(pIfMan);
  if (p_00->pName != (char *)0x0) {
    __assert_fail("pNew->pName == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                  ,0x936,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
  }
  pcVar8 = p->pName;
  if (pcVar8 == (char *)0x0) {
    pcVar14 = (char *)0x0;
  }
  else {
    sVar15 = strlen(pcVar8);
    pcVar14 = (char *)malloc(sVar15 + 1);
    strcpy(pcVar14,pcVar8);
  }
  p_00->pName = pcVar14;
  pcVar8 = p->pSpec;
  if (pcVar8 == (char *)0x0) {
    pcVar14 = (char *)0x0;
  }
  else {
    sVar15 = strlen(pcVar8);
    pcVar14 = (char *)malloc(sVar15 + 1);
    strcpy(pcVar14,pcVar8);
  }
  p_00->pSpec = pcVar14;
  Gia_ManSetRegNum(p_00,p->nRegs);
  if (pPars->fVerboseTrace != 0) {
    p_00->pLutLib = pPars->pLutLib;
    Gia_ManDelayTraceLutPrint(p_00,1);
    p_00->pLutLib = (void *)0x0;
    return p_00;
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManPerformMappingInt( Gia_Man_t * p, If_Par_t * pPars )
{
    extern void Gia_ManIffTest( Gia_Man_t * pGia, If_LibLut_t * pLib, int fVerbose );
    Gia_Man_t * pNew;
    If_Man_t * pIfMan; int i, Entry;//, Id, EntryF;
    assert( pPars->pTimesArr == NULL );
    assert( pPars->pTimesReq == NULL );
    if ( p->vCiArrs )
    {
        assert( Vec_IntSize(p->vCiArrs) == Gia_ManCiNum(p) );
        pPars->pTimesArr = ABC_CALLOC( float, Gia_ManCiNum(p) );
        Vec_IntForEachEntry( p->vCiArrs, Entry, i )
            pPars->pTimesArr[i] = (float)Entry;
    }
/*  // uncommenting this leads to a mysterious memory corruption 
    else if ( p->vInArrs )
    {
        assert( Vec_FltSize(p->vInArrs) == Gia_ManCiNum(p) );
        pPars->pTimesArr = ABC_CALLOC( float, Gia_ManCiNum(p));
        Gia_ManForEachCiId( p, Id, i )
            pPars->pTimesArr[i] = Vec_FltEntry(p->vInArrs, i);
    }
*/
    if ( p->vCoReqs )
    {
        assert( Vec_IntSize(p->vCoReqs) == Gia_ManCoNum(p) );
        pPars->pTimesReq = ABC_CALLOC( float, Gia_ManCoNum(p) );
        Vec_IntForEachEntry( p->vCoReqs, Entry, i )
            pPars->pTimesReq[i] = (float)Entry;
    }
/*  // uncommenting this leads to a mysterious memory corruption 
    else if ( p->vOutReqs )
    {
        assert( Vec_FltSize(p->vOutReqs) == Gia_ManCoNum(p) );
        pPars->pTimesReq = ABC_CALLOC( float, Gia_ManCoNum(p) );
        Vec_FltForEachEntry( p->vOutReqs, EntryF, i )
            pPars->pTimesReq[i] = EntryF;
    }
*/
    ABC_FREE( p->pCellStr );
    Vec_IntFreeP( &p->vConfigs );
    // disable cut minimization when GIA strucure is needed
    if ( !pPars->fDelayOpt && !pPars->fDelayOptLut && !pPars->fDsdBalance && !pPars->fUserRecLib && !pPars->fUserSesLib && !pPars->fDeriveLuts && !pPars->fUseDsd && !pPars->fUseTtPerm && !pPars->pFuncCell2 )
        pPars->fCutMin = 0;
    // translate into the mapper
    pIfMan = Gia_ManToIf( p, pPars );    
    if ( pIfMan == NULL )
        return NULL;
    // create DSD manager
    if ( pPars->fUseDsd )
    {
        If_DsdMan_t * p = (If_DsdMan_t *)Abc_FrameReadManDsd();
        assert( pPars->nLutSize <= If_DsdManVarNum(p) );
        assert( (pPars->pLutStruct == NULL && If_DsdManLutSize(p) == 0) || (pPars->pLutStruct && pPars->pLutStruct[0] - '0' == If_DsdManLutSize(p)) );
        pIfMan->pIfDsdMan = (If_DsdMan_t *)Abc_FrameReadManDsd();
        if ( pPars->fDsdBalance )
            If_DsdManAllocIsops( pIfMan->pIfDsdMan, pPars->nLutSize );
    }
    // compute switching for the IF objects
    if ( pPars->fPower )
    {
        if ( p->pManTime == NULL )
            If_ManComputeSwitching( pIfMan );
        else
            Abc_Print( 0, "Switching activity computation for designs with boxes is disabled.\n" );
    }
    if ( pPars->pReoMan )
        pIfMan->pUserMan = pPars->pReoMan;
    if ( p->pManTime )
        pIfMan->pManTim = Tim_ManDup( (Tim_Man_t *)p->pManTime, pPars->fDelayOpt || pPars->fDelayOptLut || pPars->fDsdBalance || pPars->fUserRecLib || pPars->fUserSesLib );
//    Tim_ManPrint( pIfMan->pManTim );
    if ( p->vCoAttrs )
    {
        assert( If_ManCoNum(pIfMan) == Vec_IntSize(p->vCoAttrs) );
        Vec_IntForEachEntry( p->vCoAttrs, Entry, i )
            If_ObjFanin0( If_ManCo(pIfMan, i) )->fSpec = (Entry != 0);
    }
    if ( !If_ManPerformMapping( pIfMan ) )
    {
        If_ManStop( pIfMan );
        return NULL;
    }
    if ( pPars->pFuncWrite )
        pPars->pFuncWrite( pIfMan );
    // transform the result of mapping into the new network
    if ( pIfMan->pPars->fDelayOpt || pIfMan->pPars->fDsdBalance || pIfMan->pPars->fUserRecLib || pIfMan->pPars->fUserSesLib )
        pNew = Gia_ManFromIfAig( pIfMan );
    else
        pNew = Gia_ManFromIfLogic( pIfMan );
    if ( p->vCiArrs || p->vCoReqs )
    {
        If_Obj_t * pIfObj = NULL;
        Vec_IntFreeP( &p->vCoArrs );
        p->vCoArrs = Vec_IntAlloc( Gia_ManCoNum(p) );
        If_ManForEachCo( pIfMan, pIfObj, i )
            Vec_IntPush( p->vCoArrs, (int)If_ObjArrTime(If_ObjFanin0(pIfObj)) );
    }
    If_ManStop( pIfMan );
    // transfer name
    assert( pNew->pName == NULL );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // print delay trace
    if ( pPars->fVerboseTrace )
    {
        pNew->pLutLib = pPars->pLutLib;
        Gia_ManDelayTraceLutPrint( pNew, 1 );
        pNew->pLutLib = NULL;
    }
    return pNew;
}